

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O1

inform_dist * inform_dist_uniform(size_t n)

{
  uint32_t *puVar1;
  inform_dist *piVar2;
  size_t sVar3;
  
  piVar2 = inform_dist_alloc(n);
  if ((piVar2 != (inform_dist *)0x0) && (piVar2->counts = n, n != 0)) {
    puVar1 = piVar2->histogram;
    sVar3 = 0;
    do {
      puVar1[sVar3] = 1;
      sVar3 = sVar3 + 1;
    } while (n != sVar3);
  }
  return piVar2;
}

Assistant:

inform_dist* inform_dist_uniform(size_t n)
{
    // construct a distribution of the desired size
    inform_dist *dist = inform_dist_alloc(n);
    if (dist != NULL)
    {
        // set the counts to the number of states
        dist->counts = n;
        // set the count for each state to 1
        for (size_t i = 0; i < n; ++i) dist->histogram[i] = 1;
    }
    return dist;
}